

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

bool DivisionCornerCaseHelper<short,_unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::DivisionCornerCase1
               (uint lhs,SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  bool bVar1;
  uint *i;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *this;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_24;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_22;
  uint local_20;
  uint local_1c;
  
  if (rhs.m_int < 1) {
    if (rhs.m_int == 0) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    bVar1 = DivisionNegativeCornerCaseHelper<short,_unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
            ::NegativeCornerCase(lhs,rhs,result);
    if (bVar1) {
      return true;
    }
    i = &local_20;
    local_20 = (uint)((uint)(int)rhs.m_int <= lhs);
    this = &local_24;
  }
  else {
    local_1c = lhs / (ushort)rhs.m_int;
    i = &local_1c;
    this = &local_22;
  }
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_int>
            (this,i);
  result->m_int = this->m_int;
  return true;
}

Assistant:

static bool DivisionCornerCase1( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( (T)rhs > 0 )
        {
            result = SafeInt< T, E >( lhs/(T)rhs );
            return true;
        }

        // Now rhs is either negative, or zero
        if( (T)rhs != 0 )
        {
            if( DivisionNegativeCornerCaseHelper< T, U, E, sizeof( U ) >= 4 && sizeof( T ) <= sizeof( U ) >::NegativeCornerCase( lhs, rhs, result ) )
                return true;

            result = SafeInt< T, E >(lhs/(T)rhs);
            return true;
        }

        E::SafeIntOnDivZero();
    }